

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O0

int nsvg__parseStrokeDashArray(NSVGparser *p,char *str,float *strokeDashArray)

{
  float fVar1;
  float local_74;
  int local_70;
  float sum;
  int i;
  int count;
  char item [64];
  float *strokeDashArray_local;
  char *str_local;
  NSVGparser *p_local;
  
  sum = 0.0;
  local_74 = 0.0;
  item._56_8_ = strokeDashArray;
  strokeDashArray_local = (float *)str;
  if (*str == 'n') {
    p_local._4_4_ = 0.0;
  }
  else {
    while ((*(char *)strokeDashArray_local != '\0' &&
           (strokeDashArray_local =
                 (float *)nsvg__getNextDashItem((char *)strokeDashArray_local,(char *)&i),
           (char)i != '\0'))) {
      if ((int)sum < 8) {
        fVar1 = nsvg__actualLength(p);
        fVar1 = nsvg__parseCoordinate(p,(char *)&i,0.0,fVar1);
        *(float *)(item._56_8_ + (long)(int)sum * 4) = ABS(fVar1);
        sum = (float)((int)sum + 1);
      }
    }
    for (local_70 = 0; local_70 < (int)sum; local_70 = local_70 + 1) {
      local_74 = *(float *)(item._56_8_ + (long)local_70 * 4) + local_74;
    }
    if (local_74 <= 1e-06) {
      sum = 0.0;
    }
    p_local._4_4_ = sum;
  }
  return (int)p_local._4_4_;
}

Assistant:

static int nsvg__parseStrokeDashArray(NSVGparser* p, const char* str, float* strokeDashArray)
{
	char item[64];
	int count = 0, i;
	float sum = 0.0f;

	// Handle "none"
	if (str[0] == 'n')
		return 0;

	// Parse dashes
	while (*str) {
		str = nsvg__getNextDashItem(str, item);
		if (!*item) break;
		if (count < NSVG_MAX_DASHES)
			strokeDashArray[count++] = fabsf(nsvg__parseCoordinate(p, item, 0.0f, nsvg__actualLength(p)));
	}

	for (i = 0; i < count; i++)
		sum += strokeDashArray[i];
	if (sum <= 1e-6f)
		count = 0;

	return count;
}